

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O1

void __thiscall
Utf8Decode_SequencesWithLastContinuationByteMissing_Test::
~Utf8Decode_SequencesWithLastContinuationByteMissing_Test
          (Utf8Decode_SequencesWithLastContinuationByteMissing_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (Utf8Decode, SequencesWithLastContinuationByteMissing) {
    decode_bad (bytes ({0xC0}));             // 2-byte sequence with last byte missing (U+0000)
    decode_bad (bytes ({0xE0, 0x80}));       // 3-byte sequence with last byte missing (U+0000)
    decode_bad (bytes ({0xF0, 0x80, 0x80})); // 4-byte sequence with last byte missing (U+0000)
    decode_bad (bytes ({0xDF}));             // 2-byte sequence with last byte missing (U+000007FF)
    decode_bad (bytes ({0xEF, 0xBF}));       // 3-byte sequence with last byte missing (U-0000FFFF)
    decode_bad (bytes ({0xF7, 0xBF, 0xBF})); // 4-byte sequence with last byte missing (U-001FFFFF)

    decode_bad (bytes ({0xC0, 0xE0, 0x80, 0xF0, 0x80, 0x80, 0xDF, 0xEF, 0xBF, 0xF7, 0xBF, 0xBF}));
}